

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNLLex.cpp
# Opt level: O0

void __thiscall SNLLex::sourceStream(SNLLex *this)

{
  int iVar1;
  ulong uVar2;
  string local_50;
  undefined1 local_30 [8];
  string sourceCode;
  SNLLex *this_local;
  
  sourceCode.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&local_50,(string *)&this->fileName);
  readFileAsString((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  while (iVar1 = this->cursor, uVar2 = std::__cxx11::string::length(), (ulong)(long)iVar1 < uVar2) {
    skipWhiteChar(this,(string *)local_30);
    iVar1 = this->cursor;
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= (ulong)(long)iVar1) break;
    resetState(this);
    resolveToken(this,(string *)local_30);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void SNLLex::sourceStream() {
    string sourceCode = readFileAsString(this->fileName);
    while (cursor < sourceCode.length()) {
        skipWhiteChar(sourceCode);
        if (cursor >= sourceCode.length()) {
            return;
        }
        resetState();
        resolveToken(sourceCode);
    }
}